

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

VRDatumPtr MinVR::CreateVRDatumIntArray(void *pData)

{
  VRDatumPtrRC *extraout_RDX;
  VRDatum_conflict *in_RDI;
  VRDatumPtr VVar1;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  VRDatumIntArray *obj;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  VRDatum *in_stack_ffffffffffffffc8;
  VRDatumPtr *in_stack_ffffffffffffffd0;
  VRIntArray *in_stack_ffffffffffffffd8;
  VRDatumIntArray *in_stack_ffffffffffffffe0;
  VRDatum_conflict *__x;
  
  __x = in_RDI;
  operator_new(0x68);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  std::vector<int,_std::allocator<int>_>::vector
            (unaff_retaddr,(vector<int,_std::allocator<int>_> *)__x);
  VRDatumIntArray::VRDatumIntArray(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             (CONCAT44(in_stack_ffffffffffffffc4,uVar2) & 0xffffffff00ffffff));
  VRDatumPtr::VRDatumPtr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  VVar1.reference = extraout_RDX;
  VVar1.pData = in_RDI;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumIntArray(void *pData) {
  VRDatumIntArray *obj =
    new VRDatumIntArray(*static_cast<VRIntArray *>(pData));
  return VRDatumPtr(obj);
}